

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndirectObjectsReferenceRegistry.cpp
# Opt level: O3

EStatusCode __thiscall
IndirectObjectsReferenceRegistry::ReadState
          (IndirectObjectsReferenceRegistry *this,PDFParser *inStateReader,ObjectIDType inObjectID)

{
  pointer *ppOVar1;
  pointer pOVar2;
  iterator __position;
  PDFObject *pPVar3;
  PDFDictionary *pPVar4;
  longlong lVar5;
  PDFObjectCastPtr<PDFInteger> objectReferenceType;
  PDFObjectCastPtr<PDFDictionary> objectWriteInformationDictionary;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> it;
  PDFObjectCastPtr<PDFInteger> generationNumber;
  PDFObjectCastPtr<PDFBoolean> objectDirty;
  PDFObjectCastPtr<PDFBoolean> objectWritten;
  PDFObjectCastPtr<PDFArray> objectsWritesRegistry;
  ObjectWriteInformation newObjectInformation;
  PDFObjectCastPtr<PDFDictionary> indirectObjectsDictionary;
  RefCountPtr<PDFInteger> local_1a0;
  RefCountPtr<PDFDictionary> local_190;
  long *local_180;
  char local_178;
  long *local_170;
  RefCountPtr<PDFInteger> local_168;
  RefCountPtr<PDFBoolean> local_158;
  RefCountPtr<PDFBoolean> local_148;
  RefCountPtr<PDFArray> local_138;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  PDFParser *local_88;
  ObjectWriteInformation local_80;
  RefCountPtr<PDFDictionary> local_60;
  string local_50;
  
  local_88 = inStateReader;
  pPVar3 = PDFParser::ParseNewObject(inStateReader,inObjectID);
  pPVar4 = PDFObjectCast<PDFDictionary>(pPVar3);
  local_60._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a58a0;
  local_60.mValue = pPVar4;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mObjectsWritesRegistry","");
  pPVar3 = PDFDictionary::QueryDirectObject(pPVar4,&local_50);
  local_138.mValue = PDFObjectCast<PDFArray>(pPVar3);
  local_138._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a58d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  PDFArray::GetIterator(local_138.mValue);
  pOVar2 = (this->mObjectsWritesRegistry).
           super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mObjectsWritesRegistry).
      super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>._M_impl.
      super__Vector_impl_data._M_finish != pOVar2) {
    (this->mObjectsWritesRegistry).
    super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>._M_impl.
    super__Vector_impl_data._M_finish = pOVar2;
  }
  if (local_170 != local_180) {
    do {
      if (local_178 == '\x01') {
        local_178 = '\0';
      }
      else {
        local_170 = local_170 + 1;
        if (local_170 == local_180) break;
      }
      pPVar3 = PDFParser::ParseNewObject(local_88,*(ObjectIDType *)(*local_170 + 0x48));
      pPVar4 = PDFObjectCast<PDFDictionary>(pPVar3);
      local_190._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a58a0;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_190.mValue = pPVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"mObjectWritten","");
      pPVar3 = PDFDictionary::QueryDirectObject(pPVar4,&local_a8);
      local_148.mValue = PDFObjectCast<PDFBoolean>(pPVar3);
      local_148._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a7108;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_80.mObjectWritten = PDFBoolean::GetValue(local_148.mValue);
      pPVar4 = local_190.mValue;
      if (local_80.mObjectWritten) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"mWritePosition","");
        pPVar3 = PDFDictionary::QueryDirectObject(pPVar4,&local_c8);
        local_1a0.mValue = PDFObjectCast<PDFInteger>(pPVar3);
        local_1a0._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a7140;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        local_80.mWritePosition = PDFInteger::GetValue(local_1a0.mValue);
        RefCountPtr<PDFInteger>::~RefCountPtr(&local_1a0);
      }
      pPVar4 = local_190.mValue;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"mObjectReferenceType","")
      ;
      pPVar3 = PDFDictionary::QueryDirectObject(pPVar4,&local_e8);
      local_1a0.mValue = PDFObjectCast<PDFInteger>(pPVar3);
      local_1a0._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a7140;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      lVar5 = PDFInteger::GetValue(local_1a0.mValue);
      pPVar4 = local_190.mValue;
      local_80.mObjectReferenceType = (EObjectReferenceType)lVar5;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"mIsDirty","");
      pPVar3 = PDFDictionary::QueryDirectObject(pPVar4,&local_108);
      local_158.mValue = PDFObjectCast<PDFBoolean>(pPVar3);
      local_158._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a7108;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      local_80.mIsDirty = PDFBoolean::GetValue(local_158.mValue);
      pPVar4 = local_190.mValue;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"mGenerationNumber","");
      pPVar3 = PDFDictionary::QueryDirectObject(pPVar4,&local_128);
      local_168.mValue = PDFObjectCast<PDFInteger>(pPVar3);
      local_168._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a7140;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      local_80.mGenerationNumber = PDFInteger::GetValue(local_168.mValue);
      __position._M_current =
           (this->mObjectsWritesRegistry).
           super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mObjectsWritesRegistry).
          super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ObjectWriteInformation,std::allocator<ObjectWriteInformation>>::
        _M_realloc_insert<ObjectWriteInformation_const&>
                  ((vector<ObjectWriteInformation,std::allocator<ObjectWriteInformation>> *)this,
                   __position,&local_80);
      }
      else {
        *(ulong *)&(__position._M_current)->mObjectReferenceType =
             CONCAT44(local_80._20_4_,local_80.mObjectReferenceType);
        (__position._M_current)->mGenerationNumber = local_80.mGenerationNumber;
        (__position._M_current)->mObjectWritten = local_80.mObjectWritten;
        (__position._M_current)->mIsDirty = local_80.mIsDirty;
        *(undefined6 *)&(__position._M_current)->field_0x2 = local_80._2_6_;
        (__position._M_current)->mWritePosition = local_80.mWritePosition;
        ppOVar1 = &(this->mObjectsWritesRegistry).
                   super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppOVar1 = *ppOVar1 + 1;
      }
      RefCountPtr<PDFInteger>::~RefCountPtr(&local_168);
      RefCountPtr<PDFBoolean>::~RefCountPtr(&local_158);
      RefCountPtr<PDFInteger>::~RefCountPtr(&local_1a0);
      RefCountPtr<PDFBoolean>::~RefCountPtr(&local_148);
      RefCountPtr<PDFDictionary>::~RefCountPtr(&local_190);
    } while (local_170 != local_180);
  }
  RefCountPtr<PDFArray>::~RefCountPtr(&local_138);
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_60);
  return eSuccess;
}

Assistant:

EStatusCode IndirectObjectsReferenceRegistry::ReadState(PDFParser* inStateReader,ObjectIDType inObjectID)
{
	PDFObjectCastPtr<PDFDictionary> indirectObjectsDictionary(inStateReader->ParseNewObject(inObjectID));

	PDFObjectCastPtr<PDFArray> objectsWritesRegistry(indirectObjectsDictionary->QueryDirectObject("mObjectsWritesRegistry"));

	SingleValueContainerIterator<PDFObjectVector> it = objectsWritesRegistry->GetIterator();

	mObjectsWritesRegistry.clear();
	while(it.MoveNext())
	{
		ObjectWriteInformation newObjectInformation;
		PDFObjectCastPtr<PDFDictionary> objectWriteInformationDictionary(inStateReader->ParseNewObject(
																				((PDFIndirectObjectReference*)it.GetItem())->mObjectID));
		
		PDFObjectCastPtr<PDFBoolean> objectWritten(objectWriteInformationDictionary->QueryDirectObject("mObjectWritten"));

		newObjectInformation.mObjectWritten = objectWritten->GetValue();

		if(newObjectInformation.mObjectWritten)
		{
			PDFObjectCastPtr<PDFInteger> writePosition(objectWriteInformationDictionary->QueryDirectObject("mWritePosition"));
			newObjectInformation.mWritePosition = writePosition->GetValue();
		}

		PDFObjectCastPtr<PDFInteger> objectReferenceType(objectWriteInformationDictionary->QueryDirectObject("mObjectReferenceType"));
		newObjectInformation.mObjectReferenceType = (ObjectWriteInformation::EObjectReferenceType)objectReferenceType->GetValue();

		PDFObjectCastPtr<PDFBoolean> objectDirty(objectWriteInformationDictionary->QueryDirectObject("mIsDirty"));
        newObjectInformation.mIsDirty = objectDirty->GetValue();
        
        PDFObjectCastPtr<PDFInteger> generationNumber(objectWriteInformationDictionary->QueryDirectObject("mGenerationNumber"));
        newObjectInformation.mGenerationNumber = (unsigned long)generationNumber->GetValue();

		mObjectsWritesRegistry.push_back(newObjectInformation);
	}

	return PDFHummus::eSuccess;
}